

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_normalize_D(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  uchar uVar1;
  long lVar2;
  undefined1 *puVar3;
  wchar_t wVar4;
  archive_string *paVar5;
  long in_RCX;
  uint uVar6;
  long in_RDX;
  undefined1 *in_RSI;
  long *in_RDI;
  wchar_t k_1;
  wchar_t j;
  wchar_t k;
  wchar_t T;
  wchar_t V;
  wchar_t L;
  wchar_t ccc;
  wchar_t fdj;
  wchar_t fdi;
  anon_struct_8_2_74731b7c fdc [10];
  wchar_t SIndex;
  uint32_t cp2;
  uint32_t cp1;
  char *ucptr;
  _func_size_t_char_ptr_size_t_uint32_t *unparse;
  _func_wchar_t_uint32_t_ptr_char_ptr_size_t *parse;
  wchar_t tm;
  wchar_t ts;
  wchar_t spair;
  wchar_t ret;
  wchar_t n2;
  wchar_t n;
  wchar_t always_replace;
  size_t w;
  uint32_t uc2;
  uint32_t uc;
  char *endp;
  char *p;
  char *s;
  ulong in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  uint local_140;
  int local_10c;
  int local_108;
  int local_104;
  uint local_f4;
  int local_f0;
  int local_ec;
  uint local_e8 [21];
  int local_94;
  uint local_90;
  uint32_t local_8c;
  undefined1 *local_88;
  code *local_80;
  code *local_78;
  int local_6c;
  int local_68;
  int local_64;
  wchar_t local_60;
  int local_5c;
  int local_58;
  uint local_54;
  long local_50;
  uint local_48;
  uint local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  long local_20;
  long *local_10;
  wchar_t local_4;
  
  local_60 = L'\0';
  local_68 = 1;
  if ((*(uint *)(in_RCX + 0x24) & 0x400) == 0) {
    if ((*(uint *)(in_RCX + 0x24) & 0x1000) == 0) {
      if ((*(uint *)(in_RCX + 0x24) & 0x100) == 0) {
        local_54 = 0;
        if ((*(uint *)(in_RCX + 0x24) & 0x800) == 0) {
          if ((*(uint *)(in_RCX + 0x24) & 0x2000) == 0) {
            local_80 = unicode_to_utf8;
          }
          else {
            local_80 = unicode_to_utf16le;
            local_68 = 2;
          }
        }
        else {
          local_80 = unicode_to_utf16be;
          local_68 = 2;
        }
      }
      else {
        local_80 = unicode_to_utf8;
        local_54 = (uint)((*(uint *)(in_RCX + 0x24) & 0x200) == 0);
      }
    }
    else {
      local_80 = unicode_to_utf16le;
      local_68 = 2;
      local_54 = (uint)((*(uint *)(in_RCX + 0x24) & 0x2000) == 0);
    }
  }
  else {
    local_80 = unicode_to_utf16be;
    local_68 = 2;
    local_54 = (uint)((*(uint *)(in_RCX + 0x24) & 0x800) == 0);
  }
  if ((*(uint *)(in_RCX + 0x24) & 0x800) == 0) {
    if ((*(uint *)(in_RCX + 0x24) & 0x2000) == 0) {
      local_78 = cesu8_to_unicode;
      local_6c = local_68;
      local_64 = 6;
    }
    else {
      local_78 = utf16le_to_unicode;
      local_6c = 1;
      local_64 = 4;
    }
  }
  else {
    local_78 = utf16be_to_unicode;
    local_6c = 1;
    local_64 = 4;
  }
  local_30 = in_RSI;
  local_20 = in_RDX;
  local_10 = in_RDI;
  paVar5 = archive_string_ensure
                     ((archive_string *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      in_stack_fffffffffffffeb0);
  if (paVar5 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_38 = (undefined1 *)(*local_10 + local_10[1]);
    local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
LAB_0027f19e:
    local_58 = (*local_78)(&local_44,local_30,local_20);
    if (local_58 != 0) {
      while( true ) {
        if (local_58 < 0) goto LAB_0027f1e4;
        if ((local_58 == local_64) || (local_54 != 0)) {
          local_88 = (undefined1 *)0x0;
        }
        else {
          local_88 = local_30;
        }
        local_30 = local_30 + local_58;
        local_20 = local_20 - local_58;
        local_94 = local_44 - 0xac00;
        if ((-1 < local_94) && (local_94 < 0x2ba4)) break;
        if ((local_44 >> 8 < 0x1d3) && (""[local_44 >> 8] != '\0')) {
          if (local_44 < 0x1d245) {
            uVar1 = ccc_val[ccc_val_index[""[local_44 >> 8]][local_44 >> 4 & 0xf]][local_44 & 0xf];
          }
          else {
            uVar1 = '\0';
          }
          if (uVar1 != '\0') {
            if (local_88 == (undefined1 *)0x0) {
              while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
                    local_50 == 0) {
                local_10[1] = (long)local_38 - *local_10;
                paVar5 = archive_string_ensure
                                   ((archive_string *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                    in_stack_fffffffffffffeb0);
                if (paVar5 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                local_38 = (undefined1 *)(*local_10 + local_10[1]);
                local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
              }
              local_38 = local_38 + local_50;
            }
            else {
              if (local_40 < local_38 + local_58) {
                local_10[1] = (long)local_38 - *local_10;
                paVar5 = archive_string_ensure
                                   ((archive_string *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                    in_stack_fffffffffffffeb0);
                if (paVar5 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                local_38 = (undefined1 *)(*local_10 + local_10[1]);
                local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
              }
              switch(local_58) {
              case 4:
                *local_38 = *local_88;
                local_88 = local_88 + 1;
                local_38 = local_38 + 1;
              case 3:
                *local_38 = *local_88;
                local_88 = local_88 + 1;
                local_38 = local_38 + 1;
              case 2:
                *local_38 = *local_88;
                local_88 = local_88 + 1;
                local_38 = local_38 + 1;
              case 1:
                *local_38 = *local_88;
                local_38 = local_38 + 1;
              default:
                local_88 = (undefined1 *)0x0;
              }
            }
            goto LAB_0027f19e;
          }
        }
        for (local_ec = 0; wVar4 = get_nfd(&local_8c,&local_90,local_44),
            wVar4 != L'\0' && local_ec < 10; local_ec = local_ec + 1) {
          for (local_104 = local_ec; 0 < local_104; local_104 = local_104 + -1) {
            *(undefined8 *)(local_e8 + (long)local_104 * 2) =
                 *(undefined8 *)(local_e8 + (long)(local_104 + -1) * 2);
          }
          if (local_90 < 0x1d245) {
            local_140 = (uint)ccc_val[ccc_val_index[""[local_90 >> 8]][local_90 >> 4 & 0xf]]
                              [local_90 & 0xf];
          }
          else {
            local_140 = 0;
          }
          local_e8[1] = local_140;
          local_44 = local_8c;
          local_88 = (undefined1 *)0x0;
        }
        while( true ) {
          local_5c = (*local_78)(&local_48,local_30,local_20);
          uVar6 = in_stack_fffffffffffffebc & 0xffffff;
          if (0 < local_5c) {
            if (local_48 < 0x1d245) {
              in_stack_fffffffffffffeb8 =
                   (uint)ccc_val[ccc_val_index[""[local_48 >> 8]][local_48 >> 4 & 0xf]]
                         [local_48 & 0xf];
            }
            else {
              in_stack_fffffffffffffeb8 = 0;
            }
            uVar6 = in_stack_fffffffffffffebc & 0xffffff;
            local_f4 = in_stack_fffffffffffffeb8;
            if (in_stack_fffffffffffffeb8 != 0) {
              uVar6 = CONCAT13(local_ec < 10,(int3)in_stack_fffffffffffffebc);
            }
          }
          in_stack_fffffffffffffebc = uVar6;
          if ((char)(in_stack_fffffffffffffebc >> 0x18) == '\0') break;
          local_30 = local_30 + local_5c;
          local_20 = local_20 - local_5c;
          local_108 = 0;
          while ((local_108 < local_ec && ((int)local_e8[(long)local_108 * 2 + 1] <= (int)local_f4))
                ) {
            local_108 = local_108 + 1;
          }
          if (local_108 < local_ec) {
            for (local_10c = local_ec; local_108 < local_10c; local_10c = local_10c + -1) {
              *(undefined8 *)(local_e8 + (long)local_10c * 2) =
                   *(undefined8 *)(local_e8 + (long)(local_10c + -1) * 2);
            }
            local_e8[(long)local_108 * 2 + 1] = local_f4;
            local_e8[(long)local_108 * 2] = local_48;
          }
          else {
            local_e8[(long)local_ec * 2 + 1] = local_f4;
            local_e8[(long)local_ec * 2] = local_48;
          }
          local_ec = local_ec + 1;
        }
        if (local_88 == (undefined1 *)0x0) {
          while( true ) {
            local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44);
            if (local_50 != 0) break;
            local_10[1] = (long)local_38 - *local_10;
            paVar5 = archive_string_ensure
                               ((archive_string *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                in_stack_fffffffffffffeb0);
            if (paVar5 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            local_38 = (undefined1 *)(*local_10 + local_10[1]);
            local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
          }
          local_38 = local_38 + local_50;
        }
        else {
          if (local_40 < local_38 + local_58) {
            local_10[1] = (long)local_38 - *local_10;
            paVar5 = archive_string_ensure
                               ((archive_string *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                in_stack_fffffffffffffeb0);
            if (paVar5 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            local_38 = (undefined1 *)(*local_10 + local_10[1]);
            local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
          }
          in_stack_fffffffffffffeb0 = (ulong)(local_58 - 1);
          switch(in_stack_fffffffffffffeb0) {
          case 3:
            *local_38 = *local_88;
            local_88 = local_88 + 1;
            local_38 = local_38 + 1;
          case 2:
            *local_38 = *local_88;
            local_88 = local_88 + 1;
            local_38 = local_38 + 1;
          case 1:
            *local_38 = *local_88;
            local_88 = local_88 + 1;
            local_38 = local_38 + 1;
          case 0:
            puVar3 = local_38;
            local_38 = local_38 + 1;
            *puVar3 = *local_88;
          default:
            local_88 = (undefined1 *)0x0;
          }
        }
        for (local_f0 = 0; local_f0 < local_ec; local_f0 = local_f0 + 1) {
          local_44 = local_e8[(long)local_f0 * 2];
          local_88 = (undefined1 *)0x0;
          while( true ) {
            local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44);
            if (local_50 != 0) break;
            local_10[1] = (long)local_38 - *local_10;
            paVar5 = archive_string_ensure
                               ((archive_string *)
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                in_stack_fffffffffffffeb0);
            if (paVar5 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            local_38 = (undefined1 *)(*local_10 + local_10[1]);
            local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
          }
          local_38 = local_38 + local_50;
        }
        if (local_5c == 0) goto LAB_00280b5f;
        local_44 = local_48;
        local_88 = (undefined1 *)0x0;
        local_58 = local_5c;
      }
      local_44 = local_94 / 0x24c + 0x1100;
      lVar2 = (long)local_94;
      uVar6 = local_94 % 0x1c + 0x11a7;
      local_88 = (undefined1 *)0x0;
      while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
            local_50 == 0) {
        local_10[1] = (long)local_38 - *local_10;
        paVar5 = archive_string_ensure
                           ((archive_string *)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            in_stack_fffffffffffffeb0);
        if (paVar5 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
        local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
      }
      local_38 = local_38 + local_50;
      local_88 = (undefined1 *)0x0;
      local_44 = (int)((long)((ulong)(uint)((int)(lVar2 % 0x24c) >> 0x1f) << 0x20 |
                             lVar2 % 0x24c & 0xffffffffU) / 0x1c) + 0x1161;
      while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
            local_50 == 0) {
        local_10[1] = (long)local_38 - *local_10;
        paVar5 = archive_string_ensure
                           ((archive_string *)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            in_stack_fffffffffffffeb0);
        if (paVar5 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
        local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
      }
      local_38 = local_38 + local_50;
      if (uVar6 != 0x11a7) {
        local_88 = (undefined1 *)0x0;
        local_44 = uVar6;
        while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
              local_50 == 0) {
          local_10[1] = (long)local_38 - *local_10;
          paVar5 = archive_string_ensure
                             ((archive_string *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              in_stack_fffffffffffffeb0);
          if (paVar5 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          local_38 = (undefined1 *)(*local_10 + local_10[1]);
          local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
        }
        local_38 = local_38 + local_50;
      }
      goto LAB_0027f19e;
    }
LAB_00280b5f:
    local_10[1] = (long)local_38 - *local_10;
    *(undefined1 *)(*local_10 + local_10[1]) = 0;
    if (local_68 == 2) {
      *(undefined1 *)(*local_10 + 1 + local_10[1]) = 0;
    }
    local_4 = local_60;
  }
  return local_4;
LAB_0027f1e4:
  while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44), local_50 == 0) {
    local_10[1] = (long)local_38 - *local_10;
    paVar5 = archive_string_ensure
                       ((archive_string *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        in_stack_fffffffffffffeb0);
    if (paVar5 == (archive_string *)0x0) {
      return L'\xffffffff';
    }
    local_38 = (undefined1 *)(*local_10 + local_10[1]);
    local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
  }
  local_38 = local_38 + local_50;
  local_30 = local_30 + -local_58;
  local_20 = local_20 - -local_58;
  local_60 = L'\xffffffff';
  goto LAB_0027f19e;
}

Assistant:

static int
archive_string_normalize_D(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr;
		uint32_t cp1, cp2;
		int SIndex;
		struct {
			uint32_t uc;
			int ccc;
		} fdc[FDC_MAX];
		int fdi, fdj;
		int ccc;

check_first_code:
		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Hangul Decomposition. */
		if ((SIndex = uc - HC_SBASE) >= 0 && SIndex < HC_SCOUNT) {
			int L = HC_LBASE + SIndex / HC_NCOUNT;
			int V = HC_VBASE + (SIndex % HC_NCOUNT) / HC_TCOUNT;
			int T = HC_TBASE + SIndex % HC_TCOUNT;

			REPLACE_UC_WITH(L);
			WRITE_UC();
			REPLACE_UC_WITH(V);
			WRITE_UC();
			if (T != HC_TBASE) {
				REPLACE_UC_WITH(T);
				WRITE_UC();
			}
			continue;
		}
		if (IS_DECOMPOSABLE_BLOCK(uc) && CCC(uc) != 0) {
			WRITE_UC();
			continue;
		}

		fdi = 0;
		while (get_nfd(&cp1, &cp2, uc) && fdi < FDC_MAX) {
			int k;

			for (k = fdi; k > 0; k--)
				fdc[k] = fdc[k-1];
			fdc[0].ccc = CCC(cp2);
			fdc[0].uc = cp2;
			fdi++;
			REPLACE_UC_WITH(cp1);
		}

		/* Read following code points. */
		while ((n2 = parse(&uc2, s, len)) > 0 &&
		    (ccc = CCC(uc2)) != 0 && fdi < FDC_MAX) {
			int j, k;

			s += n2;
			len -= n2;
			for (j = 0; j < fdi; j++) {
				if (fdc[j].ccc > ccc)
					break;
			}
			if (j < fdi) {
				for (k = fdi; k > j; k--)
					fdc[k] = fdc[k-1];
				fdc[j].ccc = ccc;
				fdc[j].uc = uc2;
			} else {
				fdc[fdi].ccc = ccc;
				fdc[fdi].uc = uc2;
			}
			fdi++;
		}

		WRITE_UC();
		for (fdj = 0; fdj < fdi; fdj++) {
			REPLACE_UC_WITH(fdc[fdj].uc);
			WRITE_UC();
		}

		if (n2 == 0)
			break;
		REPLACE_UC_WITH(uc2);
		n = n2;
		goto check_first_code;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}